

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::aggregate_formatter::~aggregate_formatter(aggregate_formatter *this)

{
  aggregate_formatter *this_local;
  
  ~aggregate_formatter(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

aggregate_formatter() = default;